

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptTypedNumber.cpp
# Opt level: O1

Var Js::JavascriptTypedNumber<unsigned_long>::ToVar
              (unsigned_long value,ScriptContext *scriptContext)

{
  Type *type;
  code *pcVar1;
  bool bVar2;
  Recycler *alloc;
  RecyclableObject *this;
  undefined4 *puVar3;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (value < 0x80000000) {
    this = (RecyclableObject *)(value | 0x1000000000000);
  }
  else {
    local_48 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_8505b99;
    data.filename._0_4_ = 0x1d;
    alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_48);
    this = (RecyclableObject *)new<Memory::Recycler>(0x18,alloc,0x781bfc);
    type = &((((scriptContext->super_ScriptContextBase).javascriptLibrary)->uint64NumberTypeStatic).
            ptr)->super_Type;
    RecyclableObject::RecyclableObject(this,type);
    (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)&PTR_Finalize_015482e8;
    this[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)value;
    if (1 < type->typeId - TypeIds_Int64Number) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptTypedNumber.h"
                                  ,0x12,
                                  "(type->GetTypeId() == TypeIds_Int64Number || type->GetTypeId() == TypeIds_UInt64Number)"
                                  ,"invalid typed number");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return this;
}

Assistant:

Var JavascriptTypedNumber<unsigned __int64>::ToVar(unsigned __int64 value, ScriptContext* scriptContext)
    {
        if (!TaggedInt::IsOverflow(value))
        {
            return TaggedInt::ToVarUnchecked((uint)value);
        }
        JavascriptTypedNumber<unsigned __int64>* number = RecyclerNewLeaf(scriptContext->GetRecycler(), JavascriptUInt64Number, value,
            scriptContext->GetLibrary()->GetUInt64TypeStatic());
        return number;
    }